

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

sexp_conflict sexp_open_pipe_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  sexp_conflict res0;
  int tmp0 [2];
  sexp_gc_var_t local_38;
  
  local_38.var = &res0;
  res0 = (sexp_conflict)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  iVar1 = pipe(tmp0);
  if (iVar1 == 0) {
    res0 = (sexp_conflict)0x23e;
    for (uVar3 = 1; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      sexp_push_op(ctx,&res0,0x43e);
      dVar2 = (double)sexp_make_fileno_op(ctx,0,2,(long)tmp0[uVar3] * 2 + 1,0x3e);
      (res0->value).flonum = dVar2;
    }
  }
  else {
    res0 = (sexp_conflict)0x3e;
  }
  (ctx->value).context.saves = local_38.next;
  return res0;
}

Assistant:

sexp sexp_open_pipe_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int i = 0, err = 0;
  int tmp0[2];
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  err = pipe(tmp0);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res0 = SEXP_NULL;
  for (i=2-1; i>=0; i--) {
    sexp_push(ctx, res0, SEXP_VOID);
    sexp_car(res0) = sexp_make_fileno(ctx, sexp_make_fixnum(tmp0[i]), SEXP_FALSE);
  }
  res = res0;
  }
  sexp_gc_release1(ctx);
  return res;
}